

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Accuracy::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  float fVar1;
  uint uVar2;
  CoordType CVar3;
  Texture2D *pTVar4;
  TestLog *pTVar5;
  RenderContext *context;
  TestContext *this_00;
  int height;
  int iVar6;
  float *pfVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar13;
  NotSupportedError *this_01;
  int iVar14;
  float *pfVar15;
  Sampler *pSVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  int x;
  float *pfVar20;
  undefined8 *puVar21;
  bool bVar22;
  long lVar23;
  uint uVar24;
  float v;
  float fVar25;
  float v_1;
  float fVar26;
  float fVar27;
  RandomViewport viewport;
  Matrix<float,_2,_2> mat_1;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface idealFrame;
  Mat2 rotMatrix;
  TextureFormatInfo fmtInfo;
  float local_388;
  float local_384;
  float local_380;
  float local_37c;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  RandomViewport local_368;
  undefined1 local_358 [8];
  undefined8 local_350;
  long local_348 [2];
  float local_334;
  float local_330;
  CoordType local_32c;
  vector<float,_std::allocator<float>_> local_328;
  float local_308 [4];
  long local_2f8;
  long local_2f0;
  Texture2DMipmapCase *local_2e8;
  Surface local_2e0;
  TestLog *local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  TextureRenderer *local_2b0;
  long local_2a8;
  long local_2a0;
  Surface local_298;
  ReferenceParams local_27c;
  Sampler local_1e8;
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_2f8 = CONCAT44(extraout_var,iVar10);
  pTVar4 = this->m_texture;
  pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&pTVar4->m_refTexture);
  uVar24 = (pTVar4->m_refTexture).m_width;
  local_2c0 = (ulong)uVar24;
  uVar2 = (pTVar4->m_refTexture).m_height;
  local_2b8 = (ulong)uVar2;
  iVar18 = uVar24 * 4;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar11 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_368,(RenderTarget *)CONCAT44(extraout_var_00,iVar10),iVar18,uVar2 * 4,dVar11);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_27c,TEXTURETYPE_2D);
  local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar3 = this->m_coordType;
  tcu::Surface::Surface(&local_2e0,local_368.width,local_368.height);
  tcu::Surface::Surface(&local_298,local_368.width,local_368.height);
  iVar10 = local_368.width + 3;
  if (-1 < local_368.width) {
    iVar10 = local_368.width;
  }
  iVar6 = local_368.height + 3;
  if (-1 < local_368.height) {
    iVar6 = local_368.height;
  }
  if ((local_368.width < iVar18) ||
     (SBORROW4(local_368.height,uVar2 * 4) != (int)(local_368.height + uVar2 * -4) < 0)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
               ,0x11a);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler(&local_1e8,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  lVar13 = local_2f8;
  local_27c.sampler.compareChannel = local_1e8.compareChannel;
  local_27c.sampler.magFilter = local_1e8.magFilter;
  local_27c.sampler.lodThreshold = local_1e8.lodThreshold;
  local_27c.sampler.normalizedCoords = local_1e8.normalizedCoords;
  local_27c.sampler._25_3_ = local_1e8._25_3_;
  local_27c.sampler.compare = local_1e8.compare;
  local_27c.sampler.borderColor.v._0_8_ = local_1e8.borderColor.v._0_8_;
  local_27c.sampler.borderColor.v._8_8_ = local_1e8.borderColor.v._8_8_;
  local_27c.sampler.seamlessCubeMap = local_1e8.seamlessCubeMap;
  local_27c.sampler._53_3_ = local_1e8._53_3_;
  local_27c.sampler.depthStencilMode = local_1e8.depthStencilMode;
  local_27c.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_27c.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_27c.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_27c.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_27c.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  local_27c.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_27c.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_27c.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_27c.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_27c.super_RenderParams.flags =
       (uint)(CVar3 == COORDTYPE_PROJECTED) + (uint)(CVar3 == COORDTYPE_BASIC_BIAS) * 2;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar13 + 8))(0x84c0);
  (**(code **)(lVar13 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar13 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar13 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar13 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar13 + 0x1360))(0xde1,0x2800,0x2600);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureMipmapTests.cpp"
                  ,0x130);
  local_32c = CVar3;
  local_2c8 = pTVar5;
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  pfVar7 = local_308 + 1;
  local_2b0 = &this->m_renderer;
  lVar13 = 0;
  local_2e8 = this;
  do {
    iVar18 = (iVar6 >> 2) * (int)lVar13;
    local_2a8 = lVar13 * 4;
    lVar17 = 0;
    local_2f0 = lVar13;
    do {
      x = (iVar10 >> 2) * (int)lVar17;
      local_2a0 = lVar17 + 1;
      iVar14 = local_368.width - x;
      if (local_2a0 != 4) {
        iVar14 = iVar10 >> 2;
      }
      height = local_368.height - iVar18;
      if (local_2f0 != 3) {
        height = iVar6 >> 2;
      }
      uVar24 = (int)lVar17 + (int)local_2a8;
      CVar3 = this->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_00ea1d4d:
        getBasicTexCoord2D(&local_328,uVar24);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getBasicTexCoord2D(&local_328,uVar24);
        local_334 = (float)(int)uVar24 * 0.0625 * 6.2831855;
        local_330 = cosf(local_334);
        local_1e8.wrapT = (WrapMode)sinf(local_334);
        local_1e8.wrapS = (WrapMode)local_330;
        local_1e8.wrapR = (WrapMode)-(float)local_1e8.wrapT;
        local_1e8.minFilter = (FilterMode)local_330;
        if (uVar24 - 4 < 8) {
          fVar25 = (float)(int)(0xf - uVar24) * 0.0625;
        }
        else {
          fVar25 = 0.0;
        }
        local_358._0_4_ = 0x3f800000;
        local_358._4_4_ = SNORM_INT8;
        local_350 = (ConstPixelBufferAccess *)CONCAT44(fVar25 * 0.0 + 1.0,fVar25);
        local_308[0] = 1.0;
        local_308[1] = 0.0;
        local_308[2] = 0.0;
        local_308[3] = 1.0;
        pSVar16 = &local_1e8;
        pfVar15 = local_308;
        bVar8 = true;
        do {
          bVar9 = bVar8;
          lVar13 = 0;
          puVar21 = (undefined8 *)local_358;
          bVar8 = true;
          do {
            bVar19 = bVar8;
            fVar25 = 0.0;
            lVar23 = 0;
            bVar8 = true;
            do {
              bVar22 = bVar8;
              fVar25 = fVar25 + (float)(&pSVar16->wrapS)[lVar23 * 2] *
                                *(float *)((long)puVar21 + lVar23 * 4);
              lVar23 = 1;
              bVar8 = false;
            } while (bVar22);
            pfVar15[lVar13 * 2] = fVar25;
            lVar13 = 1;
            puVar21 = &local_350;
            bVar8 = false;
          } while (bVar19);
          pSVar16 = (Sampler *)&local_1e8.wrapT;
          pfVar15 = pfVar7;
          bVar8 = false;
        } while (bVar9);
        fVar25 = *local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        fVar1 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1];
        local_36c = 0.0;
        local_370 = 0.0;
        pfVar15 = &local_36c;
        pfVar20 = local_308;
        bVar8 = true;
        do {
          bVar9 = bVar8;
          fVar26 = 0.0;
          lVar13 = 0;
          fVar27 = fVar25;
          bVar8 = true;
          do {
            bVar19 = bVar8;
            fVar26 = fVar26 + fVar27 * pfVar20[lVar13 * 2];
            lVar13 = 1;
            fVar27 = fVar1;
            bVar8 = false;
          } while (bVar19);
          *pfVar15 = fVar26;
          pfVar15 = &local_370;
          pfVar20 = pfVar7;
          bVar8 = false;
        } while (bVar9);
        fVar25 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
        fVar1 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[3];
        local_374 = 0.0;
        local_378 = 0.0;
        pfVar15 = &local_374;
        pfVar20 = local_308;
        bVar8 = true;
        do {
          bVar9 = bVar8;
          fVar26 = 0.0;
          lVar13 = 0;
          fVar27 = fVar25;
          bVar8 = true;
          do {
            bVar19 = bVar8;
            fVar26 = fVar26 + fVar27 * pfVar20[lVar13 * 2];
            lVar13 = 1;
            fVar27 = fVar1;
            bVar8 = false;
          } while (bVar19);
          *pfVar15 = fVar26;
          pfVar15 = &local_378;
          pfVar20 = pfVar7;
          bVar8 = false;
        } while (bVar9);
        fVar25 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[4];
        fVar1 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[5];
        local_37c = 0.0;
        local_380 = 0.0;
        pfVar15 = &local_37c;
        pfVar20 = local_308;
        bVar8 = true;
        do {
          bVar9 = bVar8;
          fVar26 = 0.0;
          lVar13 = 0;
          fVar27 = fVar25;
          bVar8 = true;
          do {
            bVar19 = bVar8;
            fVar26 = fVar26 + fVar27 * pfVar20[lVar13 * 2];
            lVar13 = 1;
            fVar27 = fVar1;
            bVar8 = false;
          } while (bVar19);
          *pfVar15 = fVar26;
          pfVar15 = &local_380;
          pfVar20 = pfVar7;
          bVar8 = false;
        } while (bVar9);
        fVar25 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[6];
        fVar1 = local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[7];
        local_384 = 0.0;
        local_388 = 0.0;
        pfVar15 = &local_384;
        pfVar20 = local_308;
        bVar8 = true;
        do {
          bVar9 = bVar8;
          fVar26 = 0.0;
          lVar13 = 0;
          fVar27 = fVar25;
          bVar8 = true;
          do {
            bVar19 = bVar8;
            fVar26 = fVar26 + fVar27 * pfVar20[lVar13 * 2];
            lVar13 = 1;
            fVar27 = fVar1;
            bVar8 = false;
          } while (bVar19);
          *pfVar15 = fVar26;
          pfVar15 = &local_388;
          pfVar20 = pfVar7;
          bVar8 = false;
        } while (bVar9);
        *local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_start = local_36c;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = local_370;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = local_374;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[3] = local_378;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[4] = local_37c;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[5] = local_380;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[6] = local_384;
        local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[7] = local_388;
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_00ea1d4d;
      if (local_32c == COORDTYPE_PROJECTED) {
        local_27c.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)iterate::s_projections[lVar17].m_data;
        local_27c.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)(iterate::s_projections[lVar17].m_data + 2);
      }
      else if (local_32c == COORDTYPE_BASIC_BIAS) {
        local_27c.super_RenderParams.bias = iterate::s_bias[uVar24 & 7];
      }
      (**(code **)(local_2f8 + 0x1a00))(local_368.x + x,local_368.y + iVar18,iVar14,height);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_2b0,0,
                 local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_27c.super_RenderParams);
      iVar12 = (*local_2e8->m_renderCtx->_vptr_RenderContext[4])();
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&local_1e8,&local_298,
                 (PixelFormat *)(CONCAT44(extraout_var_01,iVar12) + 8),x,iVar18,iVar14,height);
      this = local_2e8;
      local_27c.lodMode = LODMODE_EXACT;
      local_350 = (local_2e8->m_texture->m_refTexture).m_view.m_levels;
      local_358._0_4_ = (local_2e8->m_texture->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&local_1e8,(Texture2DView *)local_358,
                 local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_27c);
      lVar17 = local_2a0;
    } while (local_2a0 != 4);
    lVar13 = local_2f0 + 1;
    if (lVar13 == 4) {
      context = this->m_renderCtx;
      local_358._0_4_ = RGBA;
      local_358._4_4_ = UNORM_INT8;
      if ((void *)local_2e0.m_pixels.m_cap != (void *)0x0) {
        local_2e0.m_pixels.m_cap = (size_t)local_2e0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1e8,(TextureFormat *)local_358,local_2e0.m_width,
                 local_2e0.m_height,1,(void *)local_2e0.m_pixels.m_cap);
      pTVar5 = local_2c8;
      glu::readPixels(context,local_368.x,local_368.y,(PixelBufferAccess *)&local_1e8);
      iVar10 = (int)local_2c0;
      iVar18 = iVar10 + 0xf;
      if (-1 < iVar10) {
        iVar18 = iVar10;
      }
      iVar6 = (int)local_2b8;
      iVar14 = iVar6 + 0xf;
      if (-1 < iVar6) {
        iVar14 = iVar6;
      }
      iVar10 = glu::TextureTestUtil::measureAccuracy
                         (pTVar5,&local_298,&local_2e0,(iVar14 >> 4) * (iVar18 >> 4),iVar6 * iVar10)
      ;
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      std::ostream::operator<<(&local_1e8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
      std::ios_base::~ios_base(local_178);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_358);
      if (local_358 != (undefined1  [8])local_348) {
        operator_delete((void *)local_358,local_348[0] + 1);
      }
      tcu::Surface::~Surface(&local_298);
      tcu::Surface::~Surface(&local_2e0);
      if (local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	// Constants.
	const deUint32				magFilter			= GL_NEAREST;

	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&	texFmt				= refTexture.getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	int							texWidth			= refTexture.getWidth();
	int							texHeight			= refTexture.getHeight();
	int							defViewportWidth	= texWidth*4;
	int							defViewportHeight	= texHeight*4;

	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;
	bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface				idealFrame			(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);

			// Render reference(s).
			{
				tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleParams.lodMode = LODMODE_EXACT;
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], sampleParams);
			}
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}